

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O1

void __thiscall ThreadPool::start(ThreadPool *this,shared_ptr<ThreadPool::Job> *job,int priority)

{
  deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
  *this_00;
  _Elt_pointer psVar1;
  _Elt_pointer psVar2;
  _Map_pointer ppsVar3;
  _Elt_pointer psVar4;
  _Elt_pointer psVar5;
  _Elt_pointer psVar6;
  _Elt_pointer psVar7;
  _Map_pointer ppsVar8;
  long lVar9;
  int iVar10;
  reference pvVar11;
  ThreadPoolThread *this_01;
  ulong uVar12;
  _Deque_iterator<std::shared_ptr<ThreadPool::Job>,_std::shared_ptr<ThreadPool::Job>_&,_std::shared_ptr<ThreadPool::Job>_*>
  local_b0;
  _Deque_iterator<std::shared_ptr<ThreadPool::Job>,_std::shared_ptr<ThreadPool::Job>_&,_std::shared_ptr<ThreadPool::Job>_*>
  local_90;
  _Deque_iterator<std::shared_ptr<ThreadPool::Job>,_std::shared_ptr<ThreadPool::Job>_&,_std::shared_ptr<ThreadPool::Job>_*>
  local_70;
  _Deque_iterator<std::shared_ptr<ThreadPool::Job>,_std::shared_ptr<ThreadPool::Job>_&,_std::shared_ptr<ThreadPool::Job>_*>
  local_50;
  
  ((job->super___shared_ptr<ThreadPool::Job,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->mPriority =
       priority;
  if (priority == -1) {
    this_01 = (ThreadPoolThread *)operator_new(0x78);
    ThreadPoolThread::ThreadPoolThread(this_01,job);
    Thread::start((Thread *)this_01,this->mPriority,this->mThreadStackSize);
    return;
  }
  iVar10 = pthread_mutex_lock((pthread_mutex_t *)&this->mMutex);
  if (iVar10 != 0) {
    std::__throw_system_error(iVar10);
  }
  this_00 = &this->mJobs;
  psVar1 = (this->mJobs).
           super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  psVar2 = (this->mJobs).
           super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar2 != psVar1) {
    ppsVar3 = (this->mJobs).
              super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    pvVar11 = std::
              deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
              ::at(this_00,(((long)(this->mJobs).
                                   super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_last - (long)psVar1
                            >> 4) + ((long)psVar2 -
                                     (long)(this->mJobs).
                                           super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
                                           ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4)
                                    + ((((ulong)((long)ppsVar3 -
                                                (long)(this->mJobs).
                                                                                                            
                                                  super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node)
                                        >> 3) - 1) + (ulong)(ppsVar3 == (_Map_pointer)0x0)) * 0x20)
                           - 1);
    if (((pvVar11->super___shared_ptr<ThreadPool::Job,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        mPriority < priority) {
      pvVar11 = std::
                deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
                ::at(this_00,0);
      if (((pvVar11->super___shared_ptr<ThreadPool::Job,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          mPriority < priority) {
        std::
        deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
        ::push_front(this_00,job);
      }
      else {
        std::
        deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
        ::push_back(this_00,job);
        psVar1 = (this->mJobs).
                 super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        psVar2 = (this->mJobs).
                 super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (psVar1 != psVar2) {
          psVar4 = (this->mJobs).
                   super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first;
          psVar5 = (this->mJobs).
                   super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last;
          ppsVar3 = (this->mJobs).
                    super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node;
          psVar6 = (this->mJobs).
                   super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_first;
          psVar7 = (this->mJobs).
                   super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_last;
          ppsVar8 = (this->mJobs).
                    super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
          uVar12 = ((long)psVar5 - (long)psVar1 >> 4) + ((long)psVar2 - (long)psVar6 >> 4) +
                   ((((ulong)((long)ppsVar8 - (long)ppsVar3) >> 3) - 1) +
                   (ulong)(ppsVar8 == (_Map_pointer)0x0)) * 0x20;
          lVar9 = 0x3f;
          if (uVar12 != 0) {
            for (; uVar12 >> lVar9 == 0; lVar9 = lVar9 + -1) {
            }
          }
          local_70._M_cur = psVar2;
          local_70._M_first = psVar6;
          local_70._M_last = psVar7;
          local_70._M_node = ppsVar8;
          local_50._M_cur = psVar1;
          local_50._M_first = psVar4;
          local_50._M_last = psVar5;
          local_50._M_node = ppsVar3;
          std::
          __introsort_loop<std::_Deque_iterator<std::shared_ptr<ThreadPool::Job>,std::shared_ptr<ThreadPool::Job>&,std::shared_ptr<ThreadPool::Job>*>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::shared_ptr<ThreadPool::Job>const&,std::shared_ptr<ThreadPool::Job>const&)>>
                    (&local_50,&local_70,(ulong)(((uint)lVar9 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<bool_(*)(const_std::shared_ptr<ThreadPool::Job>_&,_const_std::shared_ptr<ThreadPool::Job>_&)>
                      )jobLessThan);
          local_b0._M_cur = psVar2;
          local_b0._M_first = psVar6;
          local_b0._M_last = psVar7;
          local_b0._M_node = ppsVar8;
          local_90._M_cur = psVar1;
          local_90._M_first = psVar4;
          local_90._M_last = psVar5;
          local_90._M_node = ppsVar3;
          std::
          __final_insertion_sort<std::_Deque_iterator<std::shared_ptr<ThreadPool::Job>,std::shared_ptr<ThreadPool::Job>&,std::shared_ptr<ThreadPool::Job>*>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::shared_ptr<ThreadPool::Job>const&,std::shared_ptr<ThreadPool::Job>const&)>>
                    (&local_90,&local_b0,
                     (_Iter_comp_iter<bool_(*)(const_std::shared_ptr<ThreadPool::Job>_&,_const_std::shared_ptr<ThreadPool::Job>_&)>
                      )jobLessThan);
        }
      }
      goto LAB_00167b8e;
    }
  }
  std::deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>::
  push_back(this_00,job);
LAB_00167b8e:
  std::condition_variable::notify_one();
  pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
  return;
}

Assistant:

void ThreadPool::start(const std::shared_ptr<Job> &job, int priority)
{
    job->mPriority = priority;
    if (priority == Guaranteed) {
        ThreadPoolThread *t = new ThreadPoolThread(job);
        t->start(mPriority, mThreadStackSize);
        return;
    }

    std::lock_guard<std::mutex> lock(mMutex);
    if (mJobs.empty()) {
        mJobs.push_back(job);
    } else {
        if (mJobs.at(mJobs.size() - 1)->mPriority >= priority) {
            mJobs.push_back(job);
        } else if (mJobs.at(0)->mPriority < priority) {
            mJobs.push_front(job);
        } else {
            mJobs.push_back(job);
            std::sort(mJobs.begin(), mJobs.end(), jobLessThan);
        }
    }
    mCond.notify_one();
}